

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitprofiling.cpp
# Opt level: O3

int iJIT_NotifyEvent(iJIT_JVM_EVENT event_type,void *EventSpecificData)

{
  int iVar1;
  uint uVar2;
  
  if (FUNC_NotifyEvent == (TPNotify)0x0) {
    if (iJIT_DLL_is_missing != '\0') {
      return 0;
    }
    iVar1 = loadiJIT_Funcs();
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((event_type & ~iJVM_EVENT_TYPE_SHUTDOWN) == iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED) {
LAB_007ce6ce:
    iVar1 = *EventSpecificData;
  }
  else {
    if (event_type != iJVM_EVENT_TYPE_METHOD_INLINE_LOAD_FINISHED) {
      if ((event_type != iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED_V3) &&
         (event_type != iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED_V2)) goto LAB_007ce708;
      goto LAB_007ce6ce;
    }
    if (*EventSpecificData == 0) {
      return 0;
    }
    iVar1 = *(int *)((long)EventSpecificData + 4);
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_007ce708:
  if (FUNC_NotifyEvent == (TPNotify)0x0) {
    return 0;
  }
  uVar2 = (*FUNC_NotifyEvent)(event_type,EventSpecificData);
  return uVar2;
}

Assistant:

ITT_EXTERN_C int JITAPI
iJIT_NotifyEvent(iJIT_JVM_EVENT event_type, void *EventSpecificData)
{
    int ReturnValue = 0;

    /* initialization part - the collector has not been loaded yet. */
    if (!FUNC_NotifyEvent)
    {
        if (iJIT_DLL_is_missing)
            return 0;

        if (!loadiJIT_Funcs())
            return 0;
    }

    if (event_type == iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED ||
        event_type == iJVM_EVENT_TYPE_METHOD_UPDATE)
    {
        if (((piJIT_Method_Load)EventSpecificData)->method_id == 0)
            return 0;
    }
    else if (event_type == iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED_V2)
    {
        if (((piJIT_Method_Load_V2)EventSpecificData)->method_id == 0)
            return 0;
    }
    else if (event_type == iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED_V3)
    {
        if (((piJIT_Method_Load_V3)EventSpecificData)->method_id == 0)
            return 0;
    }
    else if (event_type == iJVM_EVENT_TYPE_METHOD_INLINE_LOAD_FINISHED)
    {
        if (((piJIT_Method_Inline_Load)EventSpecificData)->method_id == 0 ||
            ((piJIT_Method_Inline_Load)EventSpecificData)->parent_method_id == 0)
            return 0;
    }

    if (FUNC_NotifyEvent)
    {
        ReturnValue = (int)FUNC_NotifyEvent(event_type, EventSpecificData);
    }

    return ReturnValue;
}